

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O3

void __thiscall
TTD::RuntimeContextInfo::EnqueueRootPathObject
          (RuntimeContextInfo *this,char16 *rootName,RecyclableObject *obj)

{
  bool bVar1;
  HeapAllocator *this_00;
  TTAutoString *this_01;
  undefined **local_60;
  TTAutoString *rootStr;
  size_t local_50;
  char *local_48;
  DWORD local_40;
  RecyclableObject *local_38;
  RecyclableObject *obj_local;
  
  local_38 = obj;
  DListBase<Js::RecyclableObject_*,_RealCount>::Append<Memory::HeapAllocator>
            ((DListBase<Js::RecyclableObject_*,_RealCount> *)this,(this->m_worklist).list.allocator,
             &local_38);
  local_60 = &UtilSupport::TTAutoString::typeinfo;
  rootStr = (TTAutoString *)0x0;
  local_50 = 0xffffffffffffffff;
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTRuntimeInfoTracker.cpp"
  ;
  local_40 = 0x376;
  this_00 = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)&stack0xffffffffffffffa0);
  this_01 = (TTAutoString *)Memory::HeapAllocator::AllocT<true>(this_00,0x18);
  UtilSupport::TTAutoString::TTAutoString(this_01,rootName);
  local_60 = (undefined **)this_01;
  bVar1 = JsUtil::
          BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(&this->m_coreObjToPathMap,&local_38);
  if (!bVar1) {
    JsUtil::
    BaseDictionary<Js::RecyclableObject*,TTD::UtilSupport::TTAutoString*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::RecyclableObject*,TTD::UtilSupport::TTAutoString*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
              ((BaseDictionary<Js::RecyclableObject*,TTD::UtilSupport::TTAutoString*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)&this->m_coreObjToPathMap,&local_38,(TTAutoString **)&stack0xffffffffffffffa0);
    return;
  }
  TTDAbort_unrecoverable_error("Already in map!!!");
}

Assistant:

void RuntimeContextInfo::EnqueueRootPathObject(const char16* rootName, Js::RecyclableObject* obj)
    {
        this->m_worklist.Enqueue(obj);

        UtilSupport::TTAutoString* rootStr = TT_HEAP_NEW(UtilSupport::TTAutoString, rootName);

        TTDAssert(!this->m_coreObjToPathMap.ContainsKey(obj), "Already in map!!!");
        this->m_coreObjToPathMap.AddNew(obj, rootStr);
    }